

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_add_custom_headers(connectdata *conn,_Bool is_connect,Curl_send_buffer *req_buffer)

{
  byte bVar1;
  SessionHandle *pSVar2;
  curl_slist *pcVar3;
  int iVar4;
  CURLcode CVar5;
  byte *pbVar6;
  ushort **ppuVar7;
  char *pcVar8;
  long lVar9;
  undefined7 in_register_00000031;
  curl_slist **ppcVar10;
  curl_slist *h [2];
  long local_50;
  
  pSVar2 = conn->data;
  local_50 = 1;
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    if (((conn->bits).httpproxy == true) && ((conn->bits).tunnel_proxy == false)) {
      h[0] = (pSVar2->set).headers;
      if ((pSVar2->set).sep_headers == true) {
        h[1] = (pSVar2->set).proxyheaders;
        local_50 = 2;
      }
      goto LAB_00112caf;
    }
LAB_00112ca4:
    h[0] = (pSVar2->set).headers;
  }
  else {
    if ((pSVar2->set).sep_headers != true) goto LAB_00112ca4;
    h[0] = (pSVar2->set).proxyheaders;
  }
LAB_00112caf:
  lVar9 = 0;
  do {
    if (lVar9 == local_50) {
      return CURLE_OK;
    }
    ppcVar10 = h + lVar9;
    while (pcVar3 = *ppcVar10, pcVar3 != (curl_slist *)0x0) {
      pcVar8 = pcVar3->data;
      pbVar6 = (byte *)strchr(pcVar8,0x3a);
      if (pbVar6 == (byte *)0x0) {
        pcVar8 = strchr(pcVar8,0x3b);
        if (pcVar8 != (char *)0x0) {
          do {
            bVar1 = pcVar8[1];
            if ((ulong)bVar1 == 0) {
              if (*pcVar8 == ';') {
                *pcVar8 = ':';
                pcVar8 = pcVar3->data;
                goto LAB_00112e12;
              }
              break;
            }
            pcVar8 = pcVar8 + 1;
            ppuVar7 = __ctype_b_loc();
          } while ((*(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
        }
      }
      else {
        do {
          pbVar6 = pbVar6 + 1;
          bVar1 = *pbVar6;
          if ((ulong)bVar1 == 0) goto LAB_00112e1d;
          ppuVar7 = __ctype_b_loc();
        } while ((*(byte *)((long)*ppuVar7 + (ulong)bVar1 * 2 + 1) & 0x20) != 0);
        if ((conn->allocptr).host != (char *)0x0) {
          iVar4 = Curl_raw_nequal("Host:",pcVar8,5);
          if (iVar4 != 0) goto LAB_00112e1d;
          pcVar8 = pcVar3->data;
        }
        if ((pSVar2->set).httpreq == HTTPREQ_POST_FORM) {
          iVar4 = Curl_raw_nequal("Content-Type:",pcVar8,0xd);
          if (iVar4 != 0) goto LAB_00112e1d;
          pcVar8 = pcVar3->data;
        }
        if ((conn->bits).authneg == true) {
          iVar4 = Curl_raw_nequal("Content-Length",pcVar8,0xe);
          if (iVar4 != 0) goto LAB_00112e1d;
          pcVar8 = pcVar3->data;
        }
        if ((conn->allocptr).te != (char *)0x0) {
          iVar4 = Curl_raw_nequal("Connection",pcVar8,10);
          if (iVar4 != 0) goto LAB_00112e1d;
          pcVar8 = pcVar3->data;
        }
LAB_00112e12:
        CVar5 = Curl_add_bufferf(req_buffer,"%s\r\n",pcVar8);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
      }
LAB_00112e1d:
      ppcVar10 = &pcVar3->next;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct connectdata *conn,
                                 bool is_connect,
                                 Curl_send_buffer *req_buffer)
{
  char *ptr;
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists=1; /* by default */
  struct SessionHandle *data = conn->data;
  int i;

  enum proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = conn->bits.httpproxy && !conn->bits.tunnel_proxy?
      HEADER_PROXY:HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }

  /* loop through one or two lists */
  for(i=0; i < numlists; i++) {
    headers = h[i];

    while(headers) {
      ptr = strchr(headers->data, ':');
      if(ptr) {
        /* we require a colon for this to be a true header */

        ptr++; /* pass the colon */
        while(*ptr && ISSPACE(*ptr))
          ptr++;

        if(*ptr) {
          /* only send this if the contents was non-blank */

          if(conn->allocptr.host &&
             /* a Host: header was sent already, don't pass on any custom Host:
                header as that will produce *two* in the same request! */
             checkprefix("Host:", headers->data))
            ;
          else if(data->set.httpreq == HTTPREQ_POST_FORM &&
                  /* this header (extended by formdata.c) is sent later */
                  checkprefix("Content-Type:", headers->data))
            ;
          else if(conn->bits.authneg &&
                  /* while doing auth neg, don't allow the custom length since
                     we will force length zero then */
                  checkprefix("Content-Length", headers->data))
            ;
          else if(conn->allocptr.te &&
                  /* when asking for Transfer-Encoding, don't pass on a custom
                     Connection: */
                  checkprefix("Connection", headers->data))
            ;
          else {
            CURLcode result = Curl_add_bufferf(req_buffer, "%s\r\n",
                                               headers->data);
            if(result)
              return result;
          }
        }
      }
      else {
        ptr = strchr(headers->data, ';');
        if(ptr) {

          ptr++; /* pass the semicolon */
          while(*ptr && ISSPACE(*ptr))
            ptr++;

          if(*ptr) {
            /* this may be used for something else in the future */
          }
          else {
            if(*(--ptr) == ';') {
              CURLcode result;

              /* send no-value custom header if terminated by semicolon */
              *ptr = ':';
              result = Curl_add_bufferf(req_buffer, "%s\r\n",
                                        headers->data);
              if(result)
                return result;
            }
          }
        }
      }
      headers = headers->next;
    }
  }
  return CURLE_OK;
}